

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcher.cpp
# Opt level: O3

void __thiscall efsw::FileWatcher::FileWatcher(FileWatcher *this,bool useGenericFileWatcher)

{
  int iVar1;
  FileWatcherGeneric *this_00;
  FileWatcherInotify *this_01;
  undefined7 in_register_00000031;
  
  this->_vptr_FileWatcher = (_func_int **)&PTR__FileWatcher_0011ea90;
  this->mFollowSymlinks = false;
  this->mOutOfScopeLinks = false;
  if ((int)CONCAT71(in_register_00000031,useGenericFileWatcher) == 0) {
    this_01 = (FileWatcherInotify *)operator_new(0xf8);
    FileWatcherInotify::FileWatcherInotify(this_01,this);
    this->mImpl = (FileWatcherImpl *)this_01;
    iVar1 = (*(this_01->super_FileWatcherImpl)._vptr_FileWatcherImpl[8])(this_01);
    if ((char)iVar1 != '\0') {
      return;
    }
    if (this->mImpl != (FileWatcherImpl *)0x0) {
      (*this->mImpl->_vptr_FileWatcherImpl[1])();
      this->mImpl = (FileWatcherImpl *)0x0;
    }
    this_00 = (FileWatcherGeneric *)operator_new(0x48);
    FileWatcherGeneric::FileWatcherGeneric(this_00,this);
  }
  else {
    this_00 = (FileWatcherGeneric *)operator_new(0x48);
    FileWatcherGeneric::FileWatcherGeneric(this_00,this);
  }
  this->mImpl = &this_00->super_FileWatcherImpl;
  return;
}

Assistant:

FileWatcher::FileWatcher( bool useGenericFileWatcher ) :
	mFollowSymlinks( false ), mOutOfScopeLinks( false ) {
	if ( useGenericFileWatcher ) {
		efDEBUG( "Using backend: Generic\n" );

		mImpl = new FileWatcherGeneric( this );
	} else {
		efDEBUG( "Using backend: %s\n", BACKEND_NAME );

		mImpl = new FILEWATCHER_IMPL( this );

		if ( !mImpl->initOK() ) {
			efSAFE_DELETE( mImpl );

			efDEBUG( "Falled back to backend: %s\n", BACKEND_NAME );

			mImpl = new FileWatcherGeneric( this );
		}
	}
}